

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

result * __thiscall
lest::expression_lhs<(anonymous_namespace)::V_const&>::operator==
          (result *__return_storage_ptr__,expression_lhs<(anonymous_namespace)::V_const&> *this,
          int *rhs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint *puVar2;
  int iVar3;
  int iVar4;
  size_type sVar5;
  ostream *poVar6;
  result *extraout_RAX;
  result *extraout_RAX_00;
  result *prVar7;
  int *value;
  int *value_00;
  char *pcVar8;
  ostringstream os_1;
  ostringstream os;
  string local_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_410;
  size_type local_408;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_400;
  result *local_3f0;
  size_type local_3e8;
  undefined1 local_3e0 [32];
  result local_3c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_388;
  size_type local_380;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_368;
  size_type local_360;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358;
  bool local_348;
  long *local_340;
  long local_338;
  long local_330 [2];
  string local_320 [3];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  iVar4 = *(int *)(this + 4);
  iVar3 = *rhs;
  local_3f0 = (result *)local_3e0;
  local_3c0.decomposition._M_string_length = (size_type)__return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"==","");
  local_3e0._16_8_ = &local_3c0;
  if (local_3f0 == (result *)local_3e0) {
    local_3c0.decomposition._M_dataplus._M_p = (pointer)local_3e0._8_8_;
  }
  else {
    local_3e0._16_8_ = local_3f0;
  }
  local_3c0._1_7_ = local_3e0._1_7_;
  local_3c0.passed = local_3e0[0];
  local_3e0._24_8_ = local_3e8;
  local_3e8 = 0;
  local_3e0[0] = false;
  local_3f0 = (result *)local_3e0;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  puVar2 = (uint *)((long)&local_320[0].field_2 +
                   *(long *)(local_320[0]._M_dataplus._M_p + -0x18) + 8);
  *puVar2 = *puVar2 | 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"[V:",3);
  string_maker<int>::to_string_abi_cxx11_(&local_430,(string_maker<int> *)(this + 4),value);
  paVar1 = &local_430.field_2;
  local_368 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_430._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p == paVar1) {
    local_358._8_8_ = local_430.field_2._8_8_;
    local_368 = &local_358;
  }
  local_358._M_allocated_capacity = local_430.field_2._M_allocated_capacity;
  local_360 = local_430._M_string_length;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_320,local_368->_M_local_buf,local_430._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
  if (local_368 != &local_358) {
    operator_delete(local_368,local_358._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p == paVar1) {
    local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base(local_2b0);
  local_388 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_430._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p == paVar1) {
    local_378._8_8_ = local_430.field_2._8_8_;
    local_388 = &local_378;
  }
  local_378._M_allocated_capacity = local_430.field_2._M_allocated_capacity;
  local_380 = local_430._M_string_length;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_388->_M_local_buf,local_430._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,(char *)local_3e0._16_8_,local_3e0._24_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
  string_maker<int>::to_string_abi_cxx11_(local_320,(string_maker<int> *)rhs,value_00);
  local_430._M_dataplus._M_p = local_320[0]._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320[0]._M_dataplus._M_p == &local_320[0].field_2) {
    local_430.field_2._8_8_ = local_320[0].field_2._8_8_;
    local_430._M_dataplus._M_p = (pointer)paVar1;
  }
  local_430.field_2._M_allocated_capacity = local_320[0].field_2._M_allocated_capacity;
  local_430._M_string_length = local_320[0]._M_string_length;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,local_430._M_dataplus._M_p,local_320[0]._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != paVar1) {
    operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
  }
  if (local_388 != &local_378) {
    operator_delete(local_388,local_378._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320[0]._M_dataplus._M_p == &local_320[0].field_2) {
    local_400._8_8_ = local_320[0].field_2._8_8_;
    local_410 = &local_400;
  }
  else {
    local_410 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_320[0]._M_dataplus._M_p;
  }
  local_400._M_allocated_capacity = local_320[0].field_2._M_allocated_capacity;
  local_408 = local_320[0]._M_string_length;
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  sVar5 = local_408;
  if (local_410 == &local_400) {
    local_398._8_4_ = local_400._8_4_;
    local_398._12_4_ = local_400._12_4_;
    local_410 = &local_398;
  }
  local_398._M_allocated_capacity = local_400._M_allocated_capacity;
  local_3c0.decomposition.field_2._8_8_ = local_408;
  local_408 = 0;
  local_400._M_allocated_capacity = local_400._M_allocated_capacity & 0xffffffffffffff00;
  pcVar8 = local_410->_M_local_buf + sVar5;
  local_3c0.decomposition.field_2._M_allocated_capacity = (size_type)local_410;
  local_410 = &local_400;
  local_348 = iVar4 == iVar3;
  local_340 = local_330;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_340,local_3c0.decomposition.field_2._M_allocated_capacity,pcVar8);
  *(bool *)local_3c0.decomposition._M_string_length = local_348;
  (((text *)(local_3c0.decomposition._M_string_length + 8))->_M_dataplus)._M_p =
       (pointer)&((text *)(local_3c0.decomposition._M_string_length + 8))->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_3c0.decomposition._M_string_length + 8),local_340,
             local_338 + (long)local_340);
  if (local_340 != local_330) {
    operator_delete(local_340,local_330[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0.decomposition.field_2._M_allocated_capacity != &local_398) {
    operator_delete((void *)local_3c0.decomposition.field_2._M_allocated_capacity,
                    local_398._M_allocated_capacity + 1);
  }
  if (local_410 != &local_400) {
    operator_delete(local_410,local_400._M_allocated_capacity + 1);
  }
  prVar7 = &local_3c0;
  if ((result *)local_3e0._16_8_ != prVar7) {
    operator_delete((void *)local_3e0._16_8_,local_3c0._0_8_ + 1);
    prVar7 = extraout_RAX;
  }
  if (local_3f0 != (result *)local_3e0) {
    operator_delete(local_3f0,CONCAT71(local_3e0._1_7_,local_3e0[0]) + 1);
    prVar7 = extraout_RAX_00;
  }
  return prVar7;
}

Assistant:

result operator<=( R const & rhs ) { return result( lhs <= rhs, to_string( lhs, "<=", rhs ) ); }